

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O1

void __thiscall soplex::SPxSolverBase<double>::reinitializeVecs(SPxSolverBase<double> *this)

{
  long lVar1;
  long lVar2;
  
  this->initialized = true;
  if (this->theType == ENTER) {
    if (this->theRep == COLUMN) {
      setPrimalBounds(this);
    }
    else {
      setDualRowBounds(this);
    }
    lVar2 = 0x3e0;
    lVar1 = 0x468;
  }
  else {
    if (this->theRep == ROW) {
      setPrimalBounds(this);
    }
    else {
      setDualColBounds(this);
    }
    lVar2 = 1000;
    lVar1 = 0x470;
  }
  (**(code **)((long)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                     super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                     _vptr_ClassArray + lVar1))(this);
  (**(code **)((long)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                     super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                     _vptr_ClassArray + lVar2))(this);
  SPxBasisBase<double>::coSolve
            (&this->super_SPxBasisBase<double>,&this->theCoPvec->super_VectorBase<double>,
             this->theCoPrhs);
  computePvec(this);
  computeFrhs(this);
  SPxBasisBase<double>::solve
            (&this->super_SPxBasisBase<double>,&this->theFvec->super_VectorBase<double>,
             this->theFrhs);
  this->theShift = 0.0;
  this->lastShift = 0.0;
  if (this->theType != ENTER) {
    computeFtest(this);
    return;
  }
  computeCoTest(this);
  computeTest(this);
  return;
}

Assistant:

void SPxSolverBase<R>::reinitializeVecs()
   {

      initialized = true;

      if(type() == ENTER)
      {
         if(rep() == COLUMN)
            setPrimalBounds();
         else
            setDualRowBounds();

         setEnterBounds();
         computeEnterCoPrhs();
      }
      else
      {
         if(rep() == ROW)
            setPrimalBounds();
         else
            setDualColBounds();

         setLeaveBounds();
         computeLeaveCoPrhs();
      }

      SPxBasisBase<R>::coSolve(*theCoPvec, *theCoPrhs);
      computePvec();
      computeFrhs();
      SPxBasisBase<R>::solve(*theFvec, *theFrhs);

      theShift  = 0.0;
      lastShift = 0.0;

      if(type() == ENTER)
      {
         computeCoTest();
         computeTest();
      }
      else
      {
         computeFtest();
      }

      assert((testBounds(), 1));
   }